

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowAggregateExecutor::EvaluateInternal
          (WindowAggregateExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  type pWVar1;
  pointer pWVar2;
  type pWVar3;
  
  pWVar1 = unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
           ::operator*((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
                        *)&lstate[0x11].range_cursor);
  pWVar2 = unique_ptr<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>,_true>
           ::operator->(&this->aggregator);
  pWVar3 = unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
           ::operator*((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
                        *)(gstate + 1));
  (*pWVar2->_vptr_WindowAggregator[6])(pWVar2,pWVar3,pWVar1,lstate + 2,result,count);
  return;
}

Assistant:

void WindowAggregateExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                               DataChunk &eval_chunk, Vector &result, idx_t count,
                                               idx_t row_idx) const {
	auto &gastate = gstate.Cast<WindowAggregateExecutorGlobalState>();
	auto &lastate = lstate.Cast<WindowAggregateExecutorLocalState>();
	auto &gsink = gastate.gsink;
	D_ASSERT(aggregator);

	auto &agg_state = *lastate.aggregator_state;

	aggregator->Evaluate(*gsink, agg_state, lastate.bounds, result, count, row_idx);
}